

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

int __thiscall btSoftBody::generateBendingConstraints(btSoftBody *this,int distance,Material *mat)

{
  undefined1 *puVar1;
  uint newsize;
  Link *pLVar2;
  Node *pNVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  undefined4 *puVar10;
  long lVar11;
  undefined4 *puVar12;
  uint uVar13;
  uint uVar14;
  btSoftBody *this_00;
  undefined4 *puVar15;
  ulong uVar16;
  uint *puVar17;
  long lVar18;
  int ib;
  long local_b8;
  int local_ac;
  NodeLinks *local_a8;
  btSoftBody *local_a0;
  ulong local_98;
  btAlignedObjectArray<NodeLinks> nodeLinks;
  int ia;
  int iStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  int *local_48;
  undefined8 uStack_40;
  
  iVar4 = 0;
  if (1 < distance) {
    newsize = (this->m_nodes).m_size;
    local_ac = distance;
    local_a0 = this;
    puVar6 = (undefined4 *)operator_new__((ulong)(newsize * newsize) << 2);
    lVar11 = (long)(int)newsize;
    uVar7 = 0;
    local_98 = 0;
    if (0 < (int)newsize) {
      local_98 = (ulong)newsize;
    }
    puVar10 = puVar6;
    puVar12 = puVar6;
    for (; uVar7 != local_98; uVar7 = uVar7 + 1) {
      puVar15 = puVar10;
      for (uVar16 = 0; newsize != uVar16; uVar16 = uVar16 + 1) {
        if (uVar7 == uVar16) {
          puVar6[uVar7 * lVar11 + uVar7] = 0;
        }
        else {
          *puVar15 = 0x7fffffff;
          puVar12[uVar16] = 0x7fffffff;
        }
        puVar15 = puVar15 + lVar11;
      }
      puVar12 = puVar12 + lVar11;
      puVar10 = puVar10 + 1;
    }
    uVar13 = (local_a0->m_links).m_size;
    pLVar2 = (local_a0->m_links).m_data;
    uVar16 = 0;
    uVar7 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar7 = uVar16;
    }
    pNVar3 = (local_a0->m_nodes).m_data;
    for (; uVar7 * 0x48 - uVar16 != 0; uVar16 = uVar16 + 0x48) {
      iVar4 = (int)((*(long *)((long)pLVar2->m_n + uVar16 + 8) - (long)pNVar3) / 0x78);
      iVar5 = (int)((*(long *)((long)pLVar2->m_n + uVar16) - (long)pNVar3) / 0x78);
      puVar6[(int)(newsize * iVar4 + iVar5)] = 1;
      puVar6[(int)(iVar5 * newsize + iVar4)] = 1;
    }
    if (local_ac == 2) {
      nodeLinks.m_ownsMemory = true;
      nodeLinks.m_data = (NodeLinks *)0x0;
      nodeLinks.m_size = 0;
      nodeLinks.m_capacity = 0;
      local_48 = (int *)0x0;
      iStack_50 = 0;
      uStack_4c = 0;
      uStack_40._0_1_ = true;
      uStack_40._1_7_ = 0;
      ia = 0;
      iStack_54 = 0;
      btAlignedObjectArray<NodeLinks>::resize(&nodeLinks,newsize,(NodeLinks *)&ia);
      btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)&ia);
      lVar18 = 0x18;
      lVar9 = 0;
      while (lVar9 < (local_a0->m_links).m_size) {
        pNVar3 = (local_a0->m_nodes).m_data;
        pLVar2 = (local_a0->m_links).m_data;
        iVar4 = (int)((*(long *)((long)pLVar2->m_n + lVar18 + -0x18) - (long)pNVar3) / 0x78);
        ia = iVar4;
        ib = (int)((*(long *)((long)pLVar2->m_n + lVar18 + -0x10) - (long)pNVar3) / 0x78);
        local_b8 = lVar9;
        iVar4 = btAlignedObjectArray<int>::findLinearSearch(&nodeLinks.m_data[iVar4].m_links,&ib);
        if (iVar4 == nodeLinks.m_data[ia].m_links.m_size) {
          btAlignedObjectArray<int>::push_back(&nodeLinks.m_data[ia].m_links,&ib);
        }
        iVar4 = btAlignedObjectArray<int>::findLinearSearch(&nodeLinks.m_data[ib].m_links,&ia);
        if (iVar4 == nodeLinks.m_data[ib].m_links.m_size) {
          btAlignedObjectArray<int>::push_back(&nodeLinks.m_data[ib].m_links,&ia);
        }
        lVar18 = lVar18 + 0x48;
        lVar9 = local_b8 + 1;
      }
      local_a8 = nodeLinks.m_data;
      uVar16 = 0;
      uVar7 = nodeLinks._4_8_ & 0xffffffff;
      if (nodeLinks.m_size < 1) {
        uVar7 = uVar16;
      }
      for (; uVar16 != uVar7; uVar16 = uVar16 + 1) {
        local_b8 = (long)nodeLinks.m_data[uVar16].m_links.m_size;
        for (lVar18 = 0; lVar18 < local_b8; lVar18 = lVar18 + 1) {
          iVar4 = nodeLinks.m_data[uVar16].m_links.m_data[lVar18];
          iVar5 = nodeLinks.m_data[iVar4].m_links.m_size;
          for (lVar9 = 0; lVar9 < iVar5; lVar9 = lVar9 + 1) {
            uVar13 = nodeLinks.m_data[iVar4].m_links.m_data[lVar9];
            if (uVar16 != uVar13) {
              uVar14 = puVar6[(int)(uVar13 * newsize + iVar4)] +
                       puVar6[(int)(iVar4 * newsize + (int)uVar16)];
              iVar8 = uVar13 * newsize + (int)uVar16;
              if (uVar14 < (uint)puVar6[iVar8]) {
                puVar6[uVar16 * lVar11 + (long)(int)uVar13] = uVar14;
                puVar6[iVar8] = uVar14;
              }
            }
          }
        }
      }
      btAlignedObjectArray<NodeLinks>::~btAlignedObjectArray(&nodeLinks);
    }
    else {
      puVar10 = puVar6;
      for (uVar7 = 0; uVar7 != local_98; uVar7 = uVar7 + 1) {
        iVar4 = 1;
        puVar12 = puVar6;
        puVar15 = puVar6;
        for (uVar16 = 0; uVar16 != newsize; uVar16 = uVar16 + 1) {
          lVar18 = (long)iVar4;
          puVar17 = (uint *)(lVar11 * 4 * lVar18 + (long)puVar12);
          for (; lVar18 < lVar11; lVar18 = lVar18 + 1) {
            uVar13 = puVar6[uVar7 + uVar16 * lVar11] + puVar10[lVar18];
            if (uVar13 < (uint)puVar15[lVar18]) {
              *puVar17 = uVar13;
              puVar15[lVar18] = uVar13;
            }
            puVar17 = puVar17 + lVar11;
          }
          iVar4 = iVar4 + 1;
          puVar15 = puVar15 + lVar11;
          puVar12 = puVar12 + 1;
        }
        puVar10 = puVar10 + lVar11;
      }
    }
    iVar5 = 1;
    iVar4 = 0;
    this_00 = local_a0;
    puVar10 = puVar6;
    for (uVar7 = 0; uVar7 != local_98; uVar7 = uVar7 + 1) {
      local_a8 = (NodeLinks *)CONCAT44(local_a8._4_4_,iVar5);
      for (lVar18 = (long)iVar5; lVar18 < lVar11; lVar18 = lVar18 + 1) {
        if (puVar10[lVar18] == local_ac) {
          local_b8 = CONCAT44(local_b8._4_4_,iVar4);
          appendLink(this_00,(int)lVar18,(int)uVar7,mat,false);
          puVar1 = &(local_a0->m_links).m_data[(long)(local_a0->m_links).m_size + -1].field_0x24;
          *puVar1 = *puVar1 | 1;
          iVar4 = (int)local_b8 + 1;
          this_00 = local_a0;
        }
      }
      iVar5 = (int)local_a8 + 1;
      puVar10 = puVar10 + lVar11;
    }
    operator_delete__(puVar6);
  }
  return iVar4;
}

Assistant:

int				btSoftBody::generateBendingConstraints(int distance,Material* mat)
{
	int i,j;

	if(distance>1)
	{
		/* Build graph	*/ 
		const int		n=m_nodes.size();
		const unsigned	inf=(~(unsigned)0)>>1;
		unsigned*		adj=new unsigned[n*n];
		

#define IDX(_x_,_y_)	((_y_)*n+(_x_))
		for(j=0;j<n;++j)
		{
			for(i=0;i<n;++i)
			{
				if(i!=j)
				{
					adj[IDX(i,j)]=adj[IDX(j,i)]=inf;
				}
				else
				{
					adj[IDX(i,j)]=adj[IDX(j,i)]=0;
				}
			}
		}
		for( i=0;i<m_links.size();++i)
		{
			const int	ia=(int)(m_links[i].m_n[0]-&m_nodes[0]);
			const int	ib=(int)(m_links[i].m_n[1]-&m_nodes[0]);
			adj[IDX(ia,ib)]=1;
			adj[IDX(ib,ia)]=1;
		}


		//special optimized case for distance == 2
		if (distance == 2)
		{

			btAlignedObjectArray<NodeLinks> nodeLinks;


			/* Build node links */
			nodeLinks.resize(m_nodes.size());

			for( i=0;i<m_links.size();++i)
			{
				const int	ia=(int)(m_links[i].m_n[0]-&m_nodes[0]);
				const int	ib=(int)(m_links[i].m_n[1]-&m_nodes[0]);
				if (nodeLinks[ia].m_links.findLinearSearch(ib)==nodeLinks[ia].m_links.size())
					nodeLinks[ia].m_links.push_back(ib);

				if (nodeLinks[ib].m_links.findLinearSearch(ia)==nodeLinks[ib].m_links.size())
					nodeLinks[ib].m_links.push_back(ia);
			}
			for (int ii=0;ii<nodeLinks.size();ii++)
			{
				int i=ii;

				for (int jj=0;jj<nodeLinks[ii].m_links.size();jj++)
				{
					int k = nodeLinks[ii].m_links[jj];
					for (int kk=0;kk<nodeLinks[k].m_links.size();kk++)
					{
						int j = nodeLinks[k].m_links[kk];
						if (i!=j)
						{
							const unsigned	sum=adj[IDX(i,k)]+adj[IDX(k,j)];
							btAssert(sum==2);
							if(adj[IDX(i,j)]>sum)
							{
								adj[IDX(i,j)]=adj[IDX(j,i)]=sum;
							}
						}

					}
				}
			}
		} else
		{
			///generic Floyd's algorithm
			for(int k=0;k<n;++k)
			{
				for(j=0;j<n;++j)
				{
					for(i=j+1;i<n;++i)
					{
						const unsigned	sum=adj[IDX(i,k)]+adj[IDX(k,j)];
						if(adj[IDX(i,j)]>sum)
						{
							adj[IDX(i,j)]=adj[IDX(j,i)]=sum;
						}
					}
				}
			}
		}


		/* Build links	*/ 
		int	nlinks=0;
		for(j=0;j<n;++j)
		{
			for(i=j+1;i<n;++i)
			{
				if(adj[IDX(i,j)]==(unsigned)distance)
				{
					appendLink(i,j,mat);
					m_links[m_links.size()-1].m_bbending=1;
					++nlinks;
				}
			}
		}
		delete[] adj;		
		return(nlinks);
	}
	return(0);
}